

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

void av1_decoder_remove(AV1Decoder *pbi)

{
  AVxWorkerInterface *pAVar1;
  long in_RDI;
  TileDataDec *tile_data;
  AVxWorker *worker;
  DecWorkerData *thread_data;
  int worker_idx;
  int i;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffffd8;
  ThreadData *in_stack_ffffffffffffffe0;
  int in_stack_fffffffffffffff0;
  int iVar2;
  
  if (in_RDI != 0) {
    aom_free_frame_buffer(in_stack_ffffffffffffffd8);
    pAVar1 = aom_get_worker_interface();
    (*pAVar1->end)((AVxWorker *)(in_RDI + 0x9f00));
    aom_free(in_stack_ffffffffffffffe0);
    if (*(long *)(in_RDI + 0xa130) != 0) {
      for (in_stack_fffffffffffffff0 = 1; in_stack_fffffffffffffff0 < *(int *)(in_RDI + 0xa128);
          in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
        if (*(long *)(*(long *)(in_RDI + 0xa130) + (long)in_stack_fffffffffffffff0 * 0x1b0) != 0) {
          av1_free_mc_tmp_buf(in_stack_ffffffffffffffe0);
          aom_free(in_stack_ffffffffffffffe0);
        }
      }
      aom_free(in_stack_ffffffffffffffe0);
    }
    aom_free(in_stack_ffffffffffffffe0);
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0xa128); iVar2 = iVar2 + 1) {
      in_stack_ffffffffffffffe0 = (ThreadData *)(*(long *)(in_RDI + 0xa120) + (long)iVar2 * 0x38);
      pAVar1 = aom_get_worker_interface();
      (*pAVar1->end)((AVxWorker *)in_stack_ffffffffffffffe0);
    }
    if (*(long *)(in_RDI + 0x5f6e0) != 0) {
      pthread_mutex_destroy(*(pthread_mutex_t **)(in_RDI + 0x5f6e0));
      aom_free(in_stack_ffffffffffffffe0);
    }
    if (*(long *)(in_RDI + 0x5f6e8) != 0) {
      pthread_cond_destroy(*(pthread_cond_t **)(in_RDI + 0x5f6e8));
      aom_free(in_stack_ffffffffffffffe0);
    }
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x48d28); iVar2 = iVar2 + 1) {
      av1_dec_row_mt_dealloc((AV1DecRowMTSync *)in_stack_ffffffffffffffe0);
    }
    aom_free(in_stack_ffffffffffffffe0);
    aom_free(in_stack_ffffffffffffffe0);
    if (0 < *(int *)(in_RDI + 0xa128)) {
      av1_loop_filter_dealloc((AV1LfSync *)in_stack_ffffffffffffffe0);
      av1_loop_restoration_dealloc((AV1LrSync *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
      av1_dealloc_dec_jobs((AV1DecTileMTData *)0x1b554a);
    }
    av1_dec_free_cb_buf((AV1Decoder *)0x1b5554);
    av1_free_mc_tmp_buf(in_stack_ffffffffffffffe0);
    aom_img_metadata_array_free((aom_metadata_array_t *)in_stack_ffffffffffffffe0);
    av1_remove_common((AV1_COMMON *)0x1b5587);
    aom_free(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void av1_decoder_remove(AV1Decoder *pbi) {
  int i;

  if (!pbi) return;

  // Free the tile list output buffer.
  aom_free_frame_buffer(&pbi->tile_list_outbuf);

  aom_get_worker_interface()->end(&pbi->lf_worker);
  aom_free(pbi->lf_worker.data1);

  if (pbi->thread_data) {
    for (int worker_idx = 1; worker_idx < pbi->num_workers; worker_idx++) {
      DecWorkerData *const thread_data = pbi->thread_data + worker_idx;
      if (thread_data->td != NULL) {
        av1_free_mc_tmp_buf(thread_data->td);
        aom_free(thread_data->td);
      }
    }
    aom_free(pbi->thread_data);
  }
  aom_free(pbi->dcb.xd.seg_mask);

  for (i = 0; i < pbi->num_workers; ++i) {
    AVxWorker *const worker = &pbi->tile_workers[i];
    aom_get_worker_interface()->end(worker);
  }
#if CONFIG_MULTITHREAD
  if (pbi->row_mt_mutex_ != NULL) {
    pthread_mutex_destroy(pbi->row_mt_mutex_);
    aom_free(pbi->row_mt_mutex_);
  }
  if (pbi->row_mt_cond_ != NULL) {
    pthread_cond_destroy(pbi->row_mt_cond_);
    aom_free(pbi->row_mt_cond_);
  }
#endif
  for (i = 0; i < pbi->allocated_tiles; i++) {
    TileDataDec *const tile_data = pbi->tile_data + i;
    av1_dec_row_mt_dealloc(&tile_data->dec_row_mt_sync);
  }
  aom_free(pbi->tile_data);
  aom_free(pbi->tile_workers);

  if (pbi->num_workers > 0) {
    av1_loop_filter_dealloc(&pbi->lf_row_sync);
    av1_loop_restoration_dealloc(&pbi->lr_row_sync);
    av1_dealloc_dec_jobs(&pbi->tile_mt_info);
  }

  av1_dec_free_cb_buf(pbi);
#if CONFIG_ACCOUNTING
  aom_accounting_clear(&pbi->accounting);
#endif
  av1_free_mc_tmp_buf(&pbi->td);
  aom_img_metadata_array_free(pbi->metadata);
  av1_remove_common(&pbi->common);
  aom_free(pbi);
}